

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

QMatrix * Upper_Q(QMatrix *Q)

{
  LASErrIdType LVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *QResName;
  QMatrix *QRes;
  QMatrix *Q_local;
  
  Q_Lock(Q);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    QResName = (char *)malloc(0xb0);
    pcVar2 = Q_GetName(Q);
    sVar3 = strlen(pcVar2);
    pcVar2 = (char *)malloc(sVar3 + 10);
    if (((QMatrix *)QResName == (QMatrix *)0x0) || (pcVar2 == (char *)0x0)) {
      pcVar4 = Q_GetName(Q);
      LASError(LASMemAllocErr,"Upper_Q",pcVar4,(char *)0x0,(char *)0x0);
      if ((QMatrix *)QResName != (QMatrix *)0x0) {
        free(QResName);
      }
    }
    else {
      pcVar4 = Q_GetName(Q);
      sprintf(pcVar2,"Upper(%s)",pcVar4);
      Q_Constr((QMatrix *)QResName,pcVar2,Q->Dim,Q->Symmetry,Q->ElOrder,Tempor,False);
      LVar1 = LASResult();
      if (LVar1 == LASOK) {
        if ((Q->Instance == Tempor) && (Q->OwnData != False)) {
          Q->OwnData = False;
          ((QMatrix *)QResName)->OwnData = True;
        }
        ((QMatrix *)QResName)->MultiplD = 0.0;
        ((QMatrix *)QResName)->MultiplU = Q->MultiplU;
        ((QMatrix *)QResName)->MultiplL = 0.0;
        ((QMatrix *)QResName)->Len = Q->Len;
        ((QMatrix *)QResName)->El = Q->El;
        ((QMatrix *)QResName)->ElSorted = Q->ElSorted;
        ((QMatrix *)QResName)->DiagElAlloc = Q->DiagElAlloc;
        ((QMatrix *)QResName)->DiagEl = Q->DiagEl;
        ((QMatrix *)QResName)->ZeroInDiag = Q->ZeroInDiag;
        ((QMatrix *)QResName)->InvDiagEl = Q->InvDiagEl;
        ((QMatrix *)QResName)->UnitRightKer = Q->UnitRightKer;
        ((QMatrix *)QResName)->RightKerCmp = Q->RightKerCmp;
        ((QMatrix *)QResName)->UnitLeftKer = Q->UnitLeftKer;
        ((QMatrix *)QResName)->LeftKerCmp = Q->LeftKerCmp;
        ((QMatrix *)QResName)->ILUExists = Q->ILUExists;
        ((QMatrix *)QResName)->ILU = Q->ILU;
      }
    }
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
  }
  else {
    QResName = (char *)0x0;
  }
  Q_Unlock(Q);
  return (QMatrix *)QResName;
}

Assistant:

QMatrix *Upper_Q(QMatrix *Q)
/* QRes = Upper(Q), returns the upper triagonal part of the matrix Q */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q);
    
    if (LASResult() == LASOK) {
        QRes = (QMatrix *)malloc(sizeof(QMatrix));
        QResName = (char *)malloc((strlen(Q_GetName(Q)) + 10) * sizeof(char));
        if (QRes != NULL && QResName != NULL) {
            sprintf(QResName, "Upper(%s)", Q_GetName(Q));
            Q_Constr(QRes, QResName, Q->Dim, Q->Symmetry, Q->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (Q->Instance == Tempor && Q->OwnData) {
                    Q->OwnData = False;
                    QRes->OwnData = True;
                }
                QRes->MultiplD = 0.0;
                QRes->MultiplU = Q->MultiplU;
                QRes->MultiplL = 0.0;
                QRes->Len = Q->Len;
                QRes->El = Q->El;
                QRes->ElSorted = Q->ElSorted;
                QRes->DiagElAlloc = Q->DiagElAlloc;
                QRes->DiagEl = Q->DiagEl;
                QRes->ZeroInDiag = Q->ZeroInDiag;
                QRes->InvDiagEl = Q->InvDiagEl;
                QRes->UnitRightKer = Q->UnitRightKer;
                QRes->RightKerCmp = Q->RightKerCmp;
                QRes->UnitLeftKer = Q->UnitLeftKer;
                QRes->LeftKerCmp = Q->LeftKerCmp;
                QRes->ILUExists = Q->ILUExists;
                QRes->ILU = Q->ILU;
            }
        } else {
            LASError(LASMemAllocErr, "Upper_Q", Q_GetName(Q), NULL, NULL);
            if (QRes != NULL)
                free(QRes);
        }
            
        if (QResName != NULL)
            free(QResName);
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q);

    return(QRes);
}